

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

char * read_referenced_name
                 (dwarf_data *ddata,unit *u,uint64_t offset,backtrace_error_callback error_callback,
                 void *data)

{
  dwarf_sections *dwarf_sections;
  int iVar1;
  uint64_t code;
  abbrev *paVar2;
  anon_union_8_3_08205623_for_u aVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_b0 [8];
  dwarf_buf unit_buf;
  attr_val val;
  char *s;
  anon_union_8_3_08205623_for_u local_38;
  char *ret;
  
  uVar4 = offset - u->unit_data_offset;
  if ((offset < u->unit_data_offset) ||
     (unit_buf.buf = (uchar *)(u->unit_data_len - uVar4),
     u->unit_data_len < uVar4 || unit_buf.buf == (uchar *)0x0)) {
    (*error_callback)(data,"abstract origin or specification out of range",0);
    local_38.uint = 0;
  }
  else {
    local_b0 = (undefined1  [8])0x136011;
    unit_buf.name = (char *)(ddata->dwarf_sections).data[0];
    unit_buf.start = u->unit_data + uVar4;
    unit_buf.left._0_4_ = ddata->is_bigendian;
    unit_buf.data._0_4_ = 0;
    unit_buf._32_8_ = error_callback;
    unit_buf.error_callback = (backtrace_error_callback)data;
    code = read_uleb128((dwarf_buf *)local_b0);
    if (code == 0) {
      dwarf_buf_error((dwarf_buf *)local_b0,"invalid abstract origin or specification",0);
      local_38.uint = 0;
    }
    else {
      paVar2 = lookup_abbrev(&u->abbrevs,code,error_callback,data);
      if (paVar2 == (abbrev *)0x0) {
LAB_001305ce:
        local_38.uint = 0;
      }
      else {
        dwarf_sections = &ddata->dwarf_sections;
        local_38.uint = 0;
        lVar5 = 0;
        for (uVar4 = 0; uVar4 < paVar2->num_attrs; uVar4 = uVar4 + 1) {
          iVar1 = read_attribute(*(dwarf_form *)((long)&paVar2->attrs->form + lVar5),
                                 *(uint64_t *)((long)&paVar2->attrs->val + lVar5),
                                 (dwarf_buf *)local_b0,u->is_dwarf64,u->version,u->addrsize,
                                 dwarf_sections,ddata->altlink,
                                 (attr_val *)&unit_buf.reported_underflow);
          if (iVar1 == 0) goto LAB_001305ce;
          iVar1 = *(int *)((long)&paVar2->attrs->name + lVar5);
          if (iVar1 == 0x2007) {
LAB_00130538:
            val.u.uint = 0;
            iVar1 = resolve_string(dwarf_sections,u->is_dwarf64,ddata->is_bigendian,
                                   u->str_offsets_base,(attr_val *)&unit_buf.reported_underflow,
                                   error_callback,data,&val.u.string);
            if (iVar1 == 0) goto LAB_001305ce;
            if (val.u.uint != 0) {
              return (char *)val.u.uint;
            }
          }
          else if (iVar1 == 0x47) {
            aVar3.string = read_referenced_name_from_attr
                                     (ddata,u,(attr *)((long)&paVar2->attrs->name + lVar5),
                                      (attr_val *)&unit_buf.reported_underflow,error_callback,data);
            if ((char *)aVar3.uint != (char *)0x0) {
              local_38.string = aVar3.string;
            }
          }
          else {
            if (iVar1 == 0x6e) goto LAB_00130538;
            if (((iVar1 == 3) && ((char *)local_38.uint == (char *)0x0)) &&
               (iVar1 = resolve_string(dwarf_sections,u->is_dwarf64,ddata->is_bigendian,
                                       u->str_offsets_base,(attr_val *)&unit_buf.reported_underflow,
                                       error_callback,data,&local_38.string), iVar1 == 0))
            goto LAB_001305ce;
          }
          lVar5 = lVar5 + 0x10;
        }
      }
    }
  }
  return (char *)local_38.uint;
}

Assistant:

static const char *
read_referenced_name (struct dwarf_data *ddata, struct unit *u,
		      uint64_t offset, backtrace_error_callback error_callback,
		      void *data)
{
  struct dwarf_buf unit_buf;
  uint64_t code;
  const struct abbrev *abbrev;
  const char *ret;
  size_t i;

  /* OFFSET is from the start of the data for this compilation unit.
     U->unit_data is the data, but it starts U->unit_data_offset bytes
     from the beginning.  */

  if (offset < u->unit_data_offset
      || offset - u->unit_data_offset >= u->unit_data_len)
    {
      error_callback (data,
		      "abstract origin or specification out of range",
		      0);
      return NULL;
    }

  offset -= u->unit_data_offset;

  unit_buf.name = ".debug_info";
  unit_buf.start = ddata->dwarf_sections.data[DEBUG_INFO];
  unit_buf.buf = u->unit_data + offset;
  unit_buf.left = u->unit_data_len - offset;
  unit_buf.is_bigendian = ddata->is_bigendian;
  unit_buf.error_callback = error_callback;
  unit_buf.data = data;
  unit_buf.reported_underflow = 0;

  code = read_uleb128 (&unit_buf);
  if (code == 0)
    {
      dwarf_buf_error (&unit_buf,
		       "invalid abstract origin or specification",
		       0);
      return NULL;
    }

  abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
  if (abbrev == NULL)
    return NULL;

  ret = NULL;
  for (i = 0; i < abbrev->num_attrs; ++i)
    {
      struct attr_val val;

      if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			   &unit_buf, u->is_dwarf64, u->version, u->addrsize,
			   &ddata->dwarf_sections, ddata->altlink, &val))
	return NULL;

      switch (abbrev->attrs[i].name)
	{
	case DW_AT_name:
	  /* Third name preference: don't override.  A name we found in some
	     other way, will normally be more useful -- e.g., this name is
	     normally not mangled.  */
	  if (ret != NULL)
	    break;
	  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
			       ddata->is_bigendian, u->str_offsets_base,
			       &val, error_callback, data, &ret))
	    return NULL;
	  break;

	case DW_AT_linkage_name:
	case DW_AT_MIPS_linkage_name:
	  /* First name preference: override all.  */
	  {
	    const char *s;

	    s = NULL;
	    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				 ddata->is_bigendian, u->str_offsets_base,
				 &val, error_callback, data, &s))
	      return NULL;
	    if (s != NULL)
	      return s;
	  }
	  break;

	case DW_AT_specification:
	  /* Second name preference: override DW_AT_name, don't override
	     DW_AT_linkage_name.  */
	  {
	    const char *name;

	    name = read_referenced_name_from_attr (ddata, u, &abbrev->attrs[i],
						   &val, error_callback, data);
	    if (name != NULL)
	      ret = name;
	  }
	  break;

	default:
	  break;
	}
    }

  return ret;
}